

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funpack.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  fpstate *pfVar2;
  undefined8 *puVar3;
  byte bVar4;
  fpstate fpvar;
  undefined8 auStack_d68 [213];
  fpstate local_6c0;
  
  bVar4 = 0;
  if (argc < 2) {
    fu_usage();
    fu_hint();
    exit(-1);
  }
  fp_init(&local_6c0);
  fu_get_param(argc,argv,&local_6c0);
  if (local_6c0.listonly == 0) {
    fp_preflight(argc,argv,1,&local_6c0);
    pfVar2 = &local_6c0;
    puVar3 = auStack_d68;
    for (lVar1 = 0xd5; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *(undefined8 *)pfVar2;
      pfVar2 = (fpstate *)((long)pfVar2 + (ulong)bVar4 * -0x10 + 8);
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    fp_loop(argc,argv,1);
  }
  else {
    pfVar2 = &local_6c0;
    puVar3 = auStack_d68;
    for (lVar1 = 0xd5; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *(undefined8 *)pfVar2;
      pfVar2 = (fpstate *)((long)pfVar2 + ((ulong)bVar4 * -2 + 1) * 8);
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    fp_list(argc,argv);
  }
  exit(0);
}

Assistant:

int main (int argc, char *argv[])
{
	fpstate	fpvar;

	if (argc <= 1) { fu_usage (); fu_hint (); exit (-1); }

	fp_init (&fpvar);
	fu_get_param (argc, argv, &fpvar);

	if (fpvar.listonly) {
	    fp_list (argc, argv, fpvar);

	} else {
	    fp_preflight (argc, argv, FUNPACK, &fpvar);
	    fp_loop (argc, argv, FUNPACK, fpvar);
	}

	exit (0);
}